

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

bool ExprEval::Operator::add_custom_operator(CustomOperator *custom_operator)

{
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  __last;
  pointer pCVar1;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *pvVar2;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  _Var3;
  _Bind<bool_(*(ExprEval::Operator::CustomOperator,_std::_Placeholder<1>))(const_ExprEval::Operator::CustomOperator_&,_const_ExprEval::Operator::CustomOperator_&)>
  local_c8;
  
  pvVar2 = get_custom_table();
  _Var3._M_current =
       (pvVar2->
       super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (pvVar2->
       super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_c8._M_f = equals;
  CustomOperator::CustomOperator((CustomOperator *)&local_c8._M_bound_args,custom_operator);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<ExprEval::Operator::CustomOperator_const*,std::vector<ExprEval::Operator::CustomOperator,std::allocator<ExprEval::Operator::CustomOperator>>>,std::_Bind<bool(*(ExprEval::Operator::CustomOperator,std::_Placeholder<1>))(ExprEval::Operator::CustomOperator_const&,ExprEval::Operator::CustomOperator_const&)>>
                    (_Var3,__last,&local_c8);
  pCVar1 = (pvVar2->
           super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  CustomOperator::~CustomOperator((CustomOperator *)&local_c8._M_bound_args);
  if (_Var3._M_current == pCVar1) {
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,custom_operator);
  }
  return _Var3._M_current == pCVar1;
}

Assistant:

bool add_custom_operator(const CustomOperator& custom_operator){
            auto custom_table = get_custom_table();
            if(std::find_if(custom_table->cbegin(), custom_table->cend(), std::bind(Operator::equals, custom_operator, std::placeholders::_1)) == custom_table->cend()){
                custom_operator_table->push_back(custom_operator);
                return true;
            }
            return false;
        }